

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPointPointShape.cpp
# Opt level: O1

void __thiscall
chrono::ChSpringShape::UpdateLineGeometry
          (ChSpringShape *this,ChVector<double> *endpoint1,ChVector<double> *endpoint2)

{
  ChLinePath *this_00;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  char cVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined8 in_XMM11_Qa;
  undefined8 in_XMM11_Qb;
  ChVector<double> dir;
  ChVector<double> Vz;
  ChVector<double> Vy;
  ChVector<double> Vx;
  ChVector<double> V2;
  ChVector<double> V1;
  ChCoordsys<double> mpos;
  ChLineSegment segment;
  ChVector<double> local_190;
  ChVector<double> local_178;
  ChVector<double> local_158;
  ChVector<double> local_138;
  ChLinePath *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  ChVector<double> local_108;
  ChVector<double> local_f0;
  ChCoordsys<double> local_d8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ChLine local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x68);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b69b40;
  *(undefined1 *)&this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 2;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChLinePath_00b658f0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[3]._M_use_count = 0;
  this_01[3]._M_weak_count = 0;
  this_01[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[4]._M_use_count = 0;
  this_01[4]._M_weak_count = 0;
  this_01[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[5]._M_use_count = 0;
  this_01[5]._M_weak_count = 0;
  this_01[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  dVar8 = endpoint2->m_data[0] - endpoint1->m_data[0];
  dVar19 = endpoint2->m_data[1] - endpoint1->m_data[1];
  dVar15 = endpoint2->m_data[2] - endpoint1->m_data[2];
  local_138.m_data[2] = 0.0;
  local_138.m_data[0] = 0.0;
  local_138.m_data[1] = 0.0;
  local_158.m_data[2] = 0.0;
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  local_178.m_data[2] = 0.0;
  local_178.m_data[0] = 0.0;
  local_178.m_data[1] = 0.0;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar19 * dVar19;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar8;
  auVar17 = vfmadd231sd_fma(auVar16,auVar20,auVar20);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar15;
  auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar18);
  if (auVar17._0_8_ < 0.0) {
    dVar7 = sqrt(auVar17._0_8_);
    auVar17._8_8_ = 0;
  }
  else {
    auVar16 = vsqrtsd_avx(auVar17,auVar17);
    dVar7 = auVar16._0_8_;
  }
  if (auVar17._0_8_ < 0.0) {
    local_190.m_data[0] = dVar8;
    local_190.m_data[1] = dVar19;
    local_190.m_data[2] = dVar15;
    local_190.m_data[2] = sqrt(auVar17._0_8_);
  }
  else {
    auVar17 = vsqrtsd_avx(auVar17,auVar17);
    local_190.m_data[2] = auVar17._0_8_;
  }
  if (local_190.m_data[2] < 2.2250738585072014e-308) {
    local_190.m_data[0] = 1.0;
    local_190.m_data[1] = 0.0;
    local_190.m_data[2] = 0.0;
  }
  else {
    local_190.m_data[2] = 1.0 / local_190.m_data[2];
    local_190.m_data[0] = dVar8 * local_190.m_data[2];
    local_190.m_data[1] = dVar19 * local_190.m_data[2];
    local_190.m_data[2] = dVar15 * local_190.m_data[2];
  }
  XdirToDxDyDz<double>(&local_190,(ChVector<double> *)&VECT_Y,&local_138,&local_158,&local_178);
  dVar10 = local_138.m_data[2];
  dVar9 = local_138.m_data[1];
  dVar2 = local_158.m_data[2];
  dVar1 = local_158.m_data[0];
  dVar15 = local_178.m_data[1];
  dVar19 = local_178.m_data[0];
  dVar8 = local_138.m_data[0] + local_158.m_data[1] + local_178.m_data[2];
  if (0.0 <= dVar8) {
    dVar8 = dVar8 + 1.0;
    if (dVar8 < 0.0) {
      local_d8.rot.m_data[3] = sqrt(dVar8);
    }
    else {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar8;
      auVar17 = vsqrtsd_avx(auVar11,auVar11);
      local_d8.rot.m_data[3] = auVar17._0_8_;
    }
    local_d8.rot.m_data[0] = local_d8.rot.m_data[3] * 0.5;
    local_d8.rot.m_data[3] = 0.5 / local_d8.rot.m_data[3];
    local_d8.rot.m_data[1] = (dVar2 - dVar15) * local_d8.rot.m_data[3];
    local_d8.rot.m_data[2] = (dVar19 - dVar10) * local_d8.rot.m_data[3];
    local_d8.rot.m_data[3] = (dVar9 - dVar1) * local_d8.rot.m_data[3];
  }
  else {
    cVar4 = local_138.m_data[0] < local_158.m_data[1];
    dVar8 = local_138.m_data[0];
    if ((bool)cVar4) {
      dVar8 = local_158.m_data[1];
    }
    if (dVar8 < local_178.m_data[2]) {
      cVar4 = '\x02';
    }
    if (cVar4 == '\x02') {
      dVar8 = ((local_178.m_data[2] - local_138.m_data[0]) - local_158.m_data[1]) + 1.0;
      if (dVar8 < 0.0) {
        local_d8.rot.m_data[0] = sqrt(dVar8);
      }
      else {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar8;
        auVar17 = vsqrtsd_avx(auVar13,auVar13);
        local_d8.rot.m_data[0] = auVar17._0_8_;
      }
      local_d8.rot.m_data[3] = local_d8.rot.m_data[0] * 0.5;
      local_d8.rot.m_data[0] = 0.5 / local_d8.rot.m_data[0];
      local_d8.rot.m_data[1] = (dVar10 + dVar19) * local_d8.rot.m_data[0];
      local_d8.rot.m_data[2] = (dVar15 + dVar2) * local_d8.rot.m_data[0];
      dVar19 = dVar9 - dVar1;
    }
    else if (cVar4 == '\x01') {
      dVar8 = ((local_158.m_data[1] - local_178.m_data[2]) - local_138.m_data[0]) + 1.0;
      if (dVar8 < 0.0) {
        local_d8.rot.m_data[0] = sqrt(dVar8);
      }
      else {
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar8;
        auVar17 = vsqrtsd_avx(auVar12,auVar12);
        local_d8.rot.m_data[0] = auVar17._0_8_;
      }
      local_d8.rot.m_data[2] = local_d8.rot.m_data[0] * 0.5;
      local_d8.rot.m_data[0] = 0.5 / local_d8.rot.m_data[0];
      local_d8.rot.m_data[3] = (dVar15 + dVar2) * local_d8.rot.m_data[0];
      local_d8.rot.m_data[1] = (dVar1 + dVar9) * local_d8.rot.m_data[0];
      dVar19 = dVar19 - dVar10;
    }
    else {
      dVar8 = ((local_138.m_data[0] - local_158.m_data[1]) - local_178.m_data[2]) + 1.0;
      if (dVar8 < 0.0) {
        local_d8.rot.m_data[0] = sqrt(dVar8);
      }
      else {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar8;
        auVar17 = vsqrtsd_avx(auVar14,auVar14);
        local_d8.rot.m_data[0] = auVar17._0_8_;
      }
      local_d8.rot.m_data[1] = local_d8.rot.m_data[0] * 0.5;
      local_d8.rot.m_data[0] = 0.5 / local_d8.rot.m_data[0];
      local_d8.rot.m_data[2] = (dVar1 + dVar9) * local_d8.rot.m_data[0];
      local_d8.rot.m_data[3] = (dVar10 + dVar19) * local_d8.rot.m_data[0];
      dVar19 = dVar2 - dVar15;
    }
    local_d8.rot.m_data[0] = dVar19 * local_d8.rot.m_data[0];
  }
  this_00 = (ChLinePath *)(this_01 + 1);
  local_d8.pos.m_data[0] = endpoint1->m_data[0];
  local_d8.pos.m_data[1] = endpoint1->m_data[1];
  local_d8.pos.m_data[2] = endpoint1->m_data[2];
  uVar5 = this->resolution;
  if (uVar5 != 0) {
    uVar6 = 0;
    dVar8 = 0.0;
    dVar19 = 0.0;
    do {
      dVar15 = (double)((int)uVar6 + 1);
      auVar3._8_8_ = in_XMM11_Qb;
      auVar3._0_8_ = in_XMM11_Qa;
      auVar17 = vcvtusi2sd_avx512f(auVar3,uVar5);
      dVar9 = (this->turns * 6.283185307179586 * dVar15) / auVar17._0_8_;
      dVar2 = (dVar15 / auVar17._0_8_) * dVar7;
      dVar15 = this->radius;
      dVar10 = cos(dVar19);
      dVar1 = this->radius;
      local_f0.m_data[2] = sin(dVar19);
      local_f0.m_data[2] = local_f0.m_data[2] * dVar1;
      dVar19 = this->radius;
      local_f0.m_data[0] = dVar8;
      local_f0.m_data[1] = dVar10 * dVar15;
      dVar15 = cos(dVar9);
      dVar8 = this->radius;
      local_108.m_data[2] = sin(dVar9);
      local_108.m_data[2] = local_108.m_data[2] * dVar8;
      local_108.m_data[0] = dVar2;
      local_108.m_data[1] = dVar15 * dVar19;
      ChCoordsys<double>::TransformLocalToParent(&local_d8,&local_f0);
      ChCoordsys<double>::TransformLocalToParent(&local_d8,&local_108);
      local_70.closed = false;
      local_70.complexityU = 2;
      local_70.super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_00b657c8;
      local_60 = local_88;
      local_58 = local_80;
      uStack_50 = uStack_78;
      local_48 = local_a0;
      local_40 = local_98;
      uStack_38 = uStack_90;
      geometry::ChLinePath::AddSubLine(this_00,&local_70,1.0);
      uVar5 = this->resolution;
      uVar6 = uVar6 + 1;
      dVar8 = dVar2;
      dVar19 = dVar9;
    } while (uVar6 < uVar5);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  (this->super_ChPointPointShape).super_ChLineShape.gline.
  super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  local_118 = this_00;
  local_110._M_pi = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChPointPointShape).super_ChLineShape.gline.
              super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_110);
  if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  return;
}

Assistant:

void ChSpringShape::UpdateLineGeometry(const ChVector<>& endpoint1, const ChVector<>& endpoint2) {
    auto linepath = chrono_types::make_shared<geometry::ChLinePath>();

    // Following part was copied from irrlicht::tools::drawSpring()
    ChVector<> dist = endpoint2 - endpoint1;
    ChVector<> Vx, Vy, Vz;
    double length = dist.Length();
    ChVector<> dir = dist.GetNormalized();
    XdirToDxDyDz(dir, VECT_Y, Vx, Vy, Vz);

    ChMatrix33<> rel_matrix(Vx, Vy, Vz);
    ChCoordsys<> mpos(endpoint1, rel_matrix.Get_A_quaternion());

    double phaseA = 0;
    double phaseB = 0;
    double heightA = 0;
    double heightB = 0;

    for (int iu = 1; iu <= resolution; iu++) {
        phaseB = turns * CH_C_2PI * (double)iu / (double)resolution;
        heightB = length * ((double)iu / (double)resolution);
        ChVector<> V1(heightA, radius * cos(phaseA), radius * sin(phaseA));
        ChVector<> V2(heightB, radius * cos(phaseB), radius * sin(phaseB));

        auto segment = geometry::ChLineSegment(mpos.TransformLocalToParent(V1), mpos.TransformLocalToParent(V2));
        linepath->AddSubLine(segment);
        phaseA = phaseB;
        heightA = heightB;
    }

    this->SetLineGeometry(std::static_pointer_cast<geometry::ChLine>(linepath));
}